

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeNF
          (ChElementTetraCorot_4 *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ
          ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  
  *detJ = this->Volume * 6.0;
  lVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar1) {
    lVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < lVar2) {
      dVar5 = ((1.0 - U) - V) - W;
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      *pdVar4 = dVar5 * *pdVar3;
      if (lVar1 == 1) goto LAB_006b30dd;
      if (lVar2 != 1) {
        pdVar4[1] = dVar5 * pdVar3[1];
        if (lVar1 < 3) goto LAB_006b30dd;
        if ((((((2 < lVar2) && (pdVar4[2] = dVar5 * pdVar3[2], lVar2 != 3)) &&
              (pdVar4[3] = U * *pdVar3, 4 < lVar2)) &&
             ((pdVar4[4] = U * pdVar3[1], lVar2 != 5 && (pdVar4[5] = U * pdVar3[2], 6 < lVar2)))) &&
            ((pdVar4[6] = V * *pdVar3, lVar2 != 7 &&
             ((pdVar4[7] = V * pdVar3[1], 8 < lVar2 && (pdVar4[8] = V * pdVar3[2], lVar2 != 9))))))
           && ((pdVar4[9] = W * *pdVar3, 10 < lVar2 && (pdVar4[10] = W * pdVar3[1], lVar2 != 0xb))))
        {
          pdVar4[0xb] = W * pdVar3[2];
          return;
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_006b30dd:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChElementTetraCorot_4::ComputeNF(const double U,
                                      const double V,
                                      const double W,
                                      ChVectorDynamic<>& Qi,
                                      double& detJ,
                                      const ChVectorDynamic<>& F,
                                      ChVectorDynamic<>* state_x,
                                      ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependent on state
    // note: U,V,W in 0..1 range, thanks to IsTetrahedronIntegrationNeeded() {return true;}
    ShapeVector N;
    this->ShapeFunctions(N, U, V, W);

    detJ = 6 * this->GetVolume();

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
}